

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

char __thiscall
duckdb::QuantileSortTree::WindowScalar<signed_char,signed_char,true>
          (QuantileSortTree *this,QuantileCursor<signed_char> *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  char cVar1;
  idx_t lidx;
  ID indirect;
  Interpolator<true> interp;
  QuantileIndirect<signed_char> local_60;
  Interpolator<true> local_58;
  
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
  operator->(&this->index_tree);
  duckdb::WindowMergeSortTree::Build();
  local_58.desc = false;
  local_58.FRN = Interpolator<true>::Index(q,n);
  local_58.begin = 0;
  local_58.CRN = local_58.FRN;
  local_58.end = n;
  lidx = SelectNth(this,frames,local_58.FRN);
  local_60.data = data;
  cVar1 = Interpolator<true>::
          Interpolate<unsigned_long,signed_char,duckdb::QuantileIndirect<signed_char>>
                    (&local_58,lidx,lidx,result,&local_60);
  return cVar1;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}